

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runner.h
# Opt level: O0

Value * __thiscall flow::Runner::Stack::operator[](Stack *this,int relativeIndex)

{
  FILE *pFVar1;
  size_type sVar2;
  undefined8 uVar3;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [36];
  int local_1c;
  Stack *pSStack_18;
  int relativeIndex_local;
  Stack *this_local;
  
  local_1c = relativeIndex;
  pSStack_18 = this;
  if (relativeIndex < 0) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->stack_);
    pFVar1 = _stderr;
    if (sVar2 <= (ulong)(long)(-1 - relativeIndex)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_40,"vm: Attempt to load from stack beyond stack top",&local_41);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s\n",uVar3);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator(&local_41);
      abort();
    }
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->stack_);
    this_local = (Stack *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    (&this->stack_,sVar2 + (long)local_1c);
  }
  else {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->stack_);
    pFVar1 = _stderr;
    if (sVar2 <= (ulong)(long)relativeIndex) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_78,"vm: Attempt to load from stack beyond stack top",&local_79);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s\n",uVar3);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator(&local_79);
      abort();
    }
    this_local = (Stack *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    (&this->stack_,(long)local_1c);
  }
  return (Value *)this_local;
}

Assistant:

Value& operator[](int relativeIndex) {
      if (relativeIndex < 0) {
        FLOW_ASSERT(static_cast<size_t>(-relativeIndex - 1) < stack_.size(),
                    "vm: Attempt to load from stack beyond stack top");
        return stack_[stack_.size() + relativeIndex];
      } else {
        FLOW_ASSERT(static_cast<size_t>(relativeIndex) < stack_.size(),
                    "vm: Attempt to load from stack beyond stack top");
        return stack_[relativeIndex];
      }
    }